

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QString * llvmReadobjPath(QString *__return_storage_ptr__,Options *options)

{
  long in_FS_OFFSET;
  QAnyStringView QVar1;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  qsizetype local_88;
  undefined1 local_80 [8];
  char16_t *local_78;
  ulong local_70;
  undefined1 local_68 [8];
  char16_t *local_60;
  ulong local_58;
  undefined1 local_50 [8];
  char16_t *local_48;
  ulong local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  QString *local_18;
  
  local_18 = *(QString **)(in_FS_OFFSET + 0x28);
  local_48 = (options->ndkPath).d.ptr;
  local_40 = (options->ndkPath).d.size | 0x8000000000000000;
  local_38 = local_50;
  local_50[0] = 1;
  local_60 = (options->toolchainPrefix).d.ptr;
  local_58 = (options->toolchainPrefix).d.size | 0x8000000000000000;
  local_30 = local_68;
  local_68[0] = 1;
  local_70 = (options->ndkHost).d.size | 0x8000000000000000;
  local_78 = (options->ndkHost).d.ptr;
  local_28 = local_80;
  local_80[0] = 1;
  local_20 = 0;
  QVar1.m_size = (size_t)"%1/toolchains/%2/prebuilt/%3/bin/llvm-readobj";
  QVar1.field_0.m_data = &local_98;
  QtPrivate::argToQString(QVar1,0x400000000000002d,(ArgBase **)0x3);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_98;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uStack_94;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uStack_90;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_8c;
  (__return_storage_ptr__->d).size = local_88;
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_18) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString llvmReadobjPath(const Options &options)
{
    return execSuffixAppended("%1/toolchains/%2/prebuilt/%3/bin/llvm-readobj"_L1
                              .arg(options.ndkPath,
                                   options.toolchainPrefix,
                                   options.ndkHost));
}